

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

U32 ZSTD_finalizeOffBase(U32 rawOffset,U32 *rep,U32 ll0)

{
  U32 local_20;
  U32 offBase;
  U32 ll0_local;
  U32 *rep_local;
  U32 rawOffset_local;
  
  if (rawOffset == 0) {
    __assert_fail("(rawOffset)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x18ea,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
  }
  local_20 = rawOffset + 3;
  if ((ll0 == 0) && (rawOffset == *rep)) {
    local_20 = 1;
  }
  else if (rawOffset == rep[1]) {
    if (ll0 == 2) {
      __assert_fail("(2 - ll0)>=1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x18ef,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
    }
    if (3 < 2 - ll0) {
      __assert_fail("(2 - ll0)<=ZSTD_REP_NUM",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x18ef,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
    }
    local_20 = 2 - ll0;
  }
  else if (rawOffset == rep[2]) {
    if (ll0 == 3) {
      __assert_fail("(3 - ll0)>=1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x18f1,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
    }
    if (3 < 3 - ll0) {
      __assert_fail("(3 - ll0)<=ZSTD_REP_NUM",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x18f1,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
    }
    local_20 = 3 - ll0;
  }
  else if ((ll0 != 0) && (rawOffset == *rep - 1)) {
    local_20 = 3;
  }
  return local_20;
}

Assistant:

static U32 ZSTD_finalizeOffBase(U32 rawOffset, const U32 rep[ZSTD_REP_NUM], U32 ll0)
{
    U32 offBase = OFFSET_TO_OFFBASE(rawOffset);

    if (!ll0 && rawOffset == rep[0]) {
        offBase = REPCODE1_TO_OFFBASE;
    } else if (rawOffset == rep[1]) {
        offBase = REPCODE_TO_OFFBASE(2 - ll0);
    } else if (rawOffset == rep[2]) {
        offBase = REPCODE_TO_OFFBASE(3 - ll0);
    } else if (ll0 && rawOffset == rep[0] - 1) {
        offBase = REPCODE3_TO_OFFBASE;
    }
    return offBase;
}